

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O2

void anon_unknown.dwarf_899df::createPositiveYEdge<double>
               (vector<double,_std::allocator<double>_> *data,
               vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *point,double x,
               double y)

{
  double *pdVar1;
  PointBase2D<double> local_30;
  
  for (pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar1 != (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
    local_30.y = y + *pdVar1;
    local_30.x = x;
    std::vector<PointBase2D<double>,std::allocator<PointBase2D<double>>>::
    emplace_back<PointBase2D<double>>
              ((vector<PointBase2D<double>,std::allocator<PointBase2D<double>>> *)point,&local_30);
  }
  return;
}

Assistant:

void createPositiveYEdge( const std::vector< _Type > & data, std::vector < PointBase2D<_Type> > & point, _Type x, _Type y )
    {
        for ( typename std::vector < _Type >::const_iterator dataY = data.cbegin(); dataY != data.cend(); ++dataY )
            point.push_back( PointBase2D<_Type>( x, y + (*dataY) ) );
    }